

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodExceptionText.cpp
# Opt level: O3

string * __thiscall
oout::MethodExceptionText::asString_abi_cxx11_
          (string *__return_storage_ptr__,MethodExceptionText *this)

{
  runtime_error *this_00;
  
  if ((this->invoker).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->invoker)._M_invoker)((_Any_data *)&this->invoker);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Class method don\'t throw exception");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string MethodExceptionText::asString() const
{
	try {
		invoker();
	} catch (const exception &e) {
		return e.what();
	}
	throw runtime_error("Class method don't throw exception");
}